

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrandom.h
# Opt level: O0

quint64 __thiscall QRandomGenerator::bounded(QRandomGenerator *this,quint64 highest)

{
  uint uVar1;
  quint64 qVar2;
  ulong uVar3;
  ulong in_RSI;
  quint64 v;
  quint64 mask;
  int width;
  
  uVar1 = qCountLeadingZeroBits(in_RSI - 1);
  do {
    qVar2 = generate64((QRandomGenerator *)0x3515c5);
    uVar3 = qVar2 & (1L << (0x40U - (char)uVar1 & 0x3f)) - 1U;
  } while (in_RSI <= uVar3);
  return uVar3;
}

Assistant:

inline quint64 QRandomGenerator::bounded(quint64 highest)
{
    // Implement an algorithm similar to libc++'s uniform_int_distribution:
    // loop around getting a random number, mask off any bits that "highest"
    // will never need, then check if it's higher than "highest". The number of
    // times the loop will run is unbounded but the probability of terminating
    // is better than 1/2 on each iteration. Therefore, the average loop count
    // should be less than 2.

    const int width = qCountLeadingZeroBits(highest - 1);
    const quint64 mask = (quint64(1) << (std::numeric_limits<quint64>::digits - width)) - 1;
    quint64 v;
    do {
        v = generate64() & mask;
    } while (v >= highest);
    return v;
}